

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss_test.cc
# Opt level: O2

void poly3_rand(poly3 *p)

{
  byte *pbVar1;
  crypto_word_t *pcVar2;
  size_t j;
  long lVar3;
  
  RAND_bytes((uchar *)p,0xb0);
  pbVar1 = (byte *)((long)(p->s).v + 0x57);
  *pbVar1 = *pbVar1 & 0x1f;
  pbVar1 = (byte *)((long)(p->a).v + 0x57);
  *pbVar1 = *pbVar1 & 0x1f;
  for (lVar3 = 0; lVar3 != 0xb; lVar3 = lVar3 + 1) {
    pcVar2 = (p->a).v + lVar3;
    *pcVar2 = *pcVar2 | (p->s).v[lVar3];
  }
  return;
}

Assistant:

static void poly3_rand(poly3 *p) {
  RAND_bytes(reinterpret_cast<uint8_t *>(p), sizeof(poly3));
  p->s.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << BITS_IN_LAST_WORD) - 1;
  p->a.v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << BITS_IN_LAST_WORD) - 1;
  // (s, a) = (1, 0) is invalid. Map those to -1.
  for (size_t j = 0; j < WORDS_PER_POLY; j++) {
    p->a.v[j] |= p->s.v[j];
  }
}